

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

int ON_GetSpanIndices(int order,int cv_count,double *knot,int *span_indices)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = cv_count - order;
  uVar4 = 0;
  uVar7 = 0;
  do {
    uVar6 = uVar7;
    span_indices[uVar4] = order + -2 + uVar6;
    if (knot == (double *)0x0) {
      return -1;
    }
    if ((int)uVar3 < (int)uVar6) {
      return -1;
    }
    uVar7 = uVar6;
    if (uVar6 < uVar3) {
      lVar5 = 0;
      do {
        uVar7 = uVar3;
        if (((ulong)uVar3 - 1) - (ulong)uVar6 == lVar5) goto LAB_004bb82a;
        lVar2 = lVar5 + -1;
        iVar1 = (int)lVar5;
        lVar5 = lVar5 + 1;
      } while ((knot[(long)order + (ulong)uVar6 + lVar2] == knot[(int)(order + uVar6 + iVar1)]) &&
              (!NAN(knot[(long)order + (ulong)uVar6 + lVar2]) &&
               !NAN(knot[(int)(order + uVar6 + iVar1)])));
      uVar7 = uVar6 + (int)lVar5;
LAB_004bb82a:
      if ((int)uVar7 < 0) {
        return -1;
      }
    }
    uVar4 = uVar4 + 1;
    if (uVar6 == uVar7) {
      span_indices[uVar4 & 0xffffffff] = order + uVar6 + -1;
      return (int)uVar4;
    }
  } while( true );
}

Assistant:

int ON_GetSpanIndices(int order, 
                            int cv_count, 
                            const double* knot, 
                            int* span_indices)

/* span_indices should have size greater than the number of 
   spans (cv_count is big enough).

  returns span count.
  fills in span_indices with index of last in each bunch of multiple knots at 
  start of span, and first in buch at end of nurb.


  */
{
  int span_index, next_span_index, j;

  span_index = -1;
  next_span_index = 0;
  j = 0;
  while (span_index != next_span_index) {
    span_index = next_span_index;
    span_indices[j] = span_index + order - 2;
    next_span_index = ON_NextNurbsSpanIndex(order, cv_count, knot, span_index);
    if (next_span_index < 0) 
      return next_span_index;
    j++;
  } 
  
  span_indices[j] = span_index + order - 1;

  return j;
}